

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_slopes.cpp
# Opt level: O2

void P_VavoomSlope(sector_t_conflict *sec,int id,DVector3 *pos,int which)

{
  double *pdVar1;
  line_t_conflict *plVar2;
  splane *psVar3;
  ulong uVar4;
  ushort uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  TVector3<double> local_38;
  
  uVar4 = 0;
  uVar5 = (ushort)*(undefined4 *)&sec->linecount;
  if ((short)uVar5 < 1) {
    uVar5 = 0;
  }
  do {
    if (uVar5 == uVar4) {
      return;
    }
    plVar2 = sec->lines[uVar4];
    uVar4 = uVar4 + 1;
  } while (plVar2->args[0] != id);
  lVar6 = 0xd8;
  psVar3 = sec->planes + 1;
  if (which == 0) {
    lVar6 = 0xb0;
    psVar3 = sec->planes;
  }
  dVar7 = pos->Z - psVar3->TexZ;
  dVar10 = pos->Y - (plVar2->v2->p).Y;
  dVar11 = pos->X - (plVar2->v1->p).X;
  dVar8 = pos->Y - (plVar2->v1->p).Y;
  dVar9 = pos->X - (plVar2->v2->p).X;
  local_38.X = dVar7 * dVar10 - dVar8 * dVar7;
  local_38.Y = dVar7 * dVar11 - dVar9 * dVar7;
  local_38.Z = dVar9 * dVar8 - dVar11 * dVar10;
  dVar7 = TVector3<double>::Length(&local_38);
  if ((dVar7 != 0.0) || (NAN(dVar7))) {
    dVar7 = 1.0 / dVar7;
    local_38.X = dVar7 * local_38.X;
    local_38.Y = dVar7 * local_38.Y;
    dVar7 = dVar7 * local_38.Z;
    if (((which == 0) && (dVar7 < 0.0)) || ((which == 1 && (0.0 < dVar7)))) {
      local_38.X = -local_38.X;
      local_38.Y = -local_38.Y;
      dVar7 = -dVar7;
    }
    dVar8 = pos->X;
    dVar9 = pos->Y;
    dVar10 = pos->Z;
    pdVar1 = (double *)((long)&sec->planes[0].xform.xOffs + lVar6);
    *pdVar1 = local_38.X;
    pdVar1[1] = local_38.Y;
    *(double *)((long)&sec->planes[0].xform.baseyOffs + lVar6) = dVar7;
    *(double *)((long)&sec->planes[0].xform.xScale + lVar6) =
         (-local_38.X * dVar8 - local_38.Y * dVar9) - dVar10 * dVar7;
    *(double *)((long)&sec->planes[0].xform.yScale + lVar6) = -1.0 / dVar7;
  }
  else {
    Printf("Slope thing at (%f,%f) lies directly on its target line.\n",pos->X,pos->Y);
  }
  return;
}

Assistant:

void P_VavoomSlope(sector_t * sec, int id, const DVector3 &pos, int which)
{
	for (int i=0;i<sec->linecount;i++)
	{
		line_t * l=sec->lines[i];

		if (l->args[0]==id)
		{
			DVector3 v1, v2, cross;
			secplane_t *srcplane = (which == 0) ? &sec->floorplane : &sec->ceilingplane;
			double srcheight = (which == 0) ? sec->GetPlaneTexZ(sector_t::floor) : sec->GetPlaneTexZ(sector_t::ceiling);

			v1[0] = pos.X - l->v2->fX();
			v1[1] = pos.Y - l->v2->fY();
			v1[2] = pos.Z - srcheight;
			
			v2[0] = pos.X - l->v1->fX();
			v2[1] = pos.Y - l->v1->fY();
			v2[2] = pos.Z - srcheight;

			cross = v1 ^ v2;
			double len = cross.Length();
			if (len == 0)
			{
				Printf ("Slope thing at (%f,%f) lies directly on its target line.\n", pos.X, pos.Y);
				return;
			}
			cross /= len;

			// Fix backward normals
			if ((cross.Z < 0 && which == 0) || (cross.Z > 0 && which == 1))
			{
				cross = -cross;
			}

			double dist = -cross[0] * pos.X - cross[1] * pos.Y - cross[2] * pos.Z;
			srcplane->set(cross[0], cross[1], cross[2], dist);
			return;
		}
	}
}